

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O0

directory * __thiscall dlib::directory::get_parent(directory *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  string *this_00;
  size_type pos;
  char sep;
  directory *temp;
  directory *in_stack_ffffffffffffff58;
  string *this_01;
  directory *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  string local_70 [48];
  string local_40 [32];
  long local_20;
  char local_12;
  undefined1 local_11;
  
  bVar1 = is_root((directory *)0x3d21e6);
  if (bVar1) {
    directory(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    local_11 = 0;
    directory((directory *)0x3d2212);
    local_12 = get_separator();
    local_20 = std::__cxx11::string::find_last_of((char)(in_RSI + 0x20U),(ulong)(uint)(int)local_12)
    ;
    std::__cxx11::string::substr((ulong)local_40,in_RSI + 0x20U);
    this_00 = in_RDI + 0x20;
    this_01 = local_40;
    std::__cxx11::string::operator=(this_00,this_01);
    std::__cxx11::string::~string(this_01);
    bVar1 = is_root_path((directory *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                         (string *)this_00);
    if (bVar1) {
      std::__cxx11::string::operator+=(in_RDI + 0x20,local_12);
    }
    else {
      local_20 = std::__cxx11::string::find_last_of((char)in_RDI + ' ',(ulong)(uint)(int)local_12);
      if (local_20 == -1) {
        std::__cxx11::string::operator+=(in_RDI + 0x20,local_12);
      }
      else {
        std::__cxx11::string::substr((ulong)local_70,(ulong)(in_RDI + 0x20));
        std::__cxx11::string::operator=(in_RDI,local_70);
        std::__cxx11::string::~string(local_70);
      }
    }
  }
  return (directory *)in_RDI;
}

Assistant:

const directory directory::
    get_parent (
    ) const
    {
        using namespace std;
        // if *this is the root then just return *this
        if (is_root())
        {
            return *this;
        }
        else
        {
            directory temp;

            const char sep = get_separator();

            string::size_type pos = state.full_name.find_last_of(sep);
            temp.state.full_name = state.full_name.substr(0,pos);

            if ( is_root_path(temp.state.full_name))
            {
                temp.state.full_name += sep;
            }
            else
            {
                pos = temp.state.full_name.find_last_of(sep);
                if (pos != string::npos)
                {
                    temp.state.name = temp.state.full_name.substr(pos+1);
                }
                else
                {
                    temp.state.full_name += sep;
                }
            }
            return temp;
        }
    }